

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_multiplier.cpp
# Opt level: O1

Scale * icu_63::number::Scale::byDouble(Scale *__return_storage_ptr__,double multiplicand)

{
  DecNum *pDVar1;
  UErrorCode *in_RSI;
  UErrorCode localError;
  LocalPointer<icu_63::number::impl::DecNum> decnum;
  UErrorCode local_24;
  DecNum *local_20;
  double local_18;
  
  local_24 = U_ZERO_ERROR;
  local_18 = multiplicand;
  local_20 = (DecNum *)UMemory::operator_new((UMemory *)0x60,(size_t)in_RSI);
  if (local_20 == (DecNum *)0x0) {
    local_20 = (DecNum *)0x0;
  }
  else {
    impl::DecNum::DecNum(local_20);
  }
  if ((local_20 == (DecNum *)0x0) && (local_24 < U_ILLEGAL_ARGUMENT_ERROR)) {
    local_24 = U_MEMORY_ALLOCATION_ERROR;
  }
  if (local_24 < U_ILLEGAL_ARGUMENT_ERROR) {
    in_RSI = &local_24;
    impl::DecNum::setTo(local_20,local_18,in_RSI);
    pDVar1 = local_20;
    if (local_24 < U_ILLEGAL_ARGUMENT_ERROR) {
      local_20 = (DecNum *)0x0;
      in_RSI = (UErrorCode *)0x0;
      Scale(__return_storage_ptr__,0,pDVar1);
      goto LAB_0025d7ee;
    }
  }
  __return_storage_ptr__->fMagnitude = 0;
  __return_storage_ptr__->fArbitrary = (DecNum *)0x0;
  __return_storage_ptr__->fError = local_24;
LAB_0025d7ee:
  pDVar1 = local_20;
  if (local_20 != (DecNum *)0x0) {
    MaybeStackHeaderAndArray<decNumber,_char,_34>::~MaybeStackHeaderAndArray(&local_20->fData);
    UMemory::operator_delete((UMemory *)pDVar1,in_RSI);
  }
  return __return_storage_ptr__;
}

Assistant:

Scale Scale::byDouble(double multiplicand) {
    UErrorCode localError = U_ZERO_ERROR;
    LocalPointer<DecNum> decnum(new DecNum(), localError);
    if (U_FAILURE(localError)) {
        return {localError};
    }
    decnum->setTo(multiplicand, localError);
    if (U_FAILURE(localError)) {
        return {localError};
    }
    return {0, decnum.orphan()};
}